

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema.c
# Opt level: O1

ly_set * lys_node_xpath_atomize(lys_node *node,int options)

{
  int iVar1;
  long *plVar2;
  lys_node *plVar3;
  ulong uVar4;
  lys_node *plVar5;
  uint uVar6;
  lys_node *plVar7;
  lys_node *node_00;
  lys_node *plVar8;
  undefined1 local_68 [8];
  lyxp_set set;
  
  plVar8 = node;
  if (node == (lys_node *)0x0) {
    return (ly_set *)0x0;
  }
  do {
    if ((plVar8->nodetype & (LYS_OUTPUT|LYS_INPUT|LYS_NOTIF)) != LYS_UNKNOWN) {
      set._40_8_ = ly_set_new();
      node_00 = node;
      if ((ly_set *)set._40_8_ == (ly_set *)0x0) {
        return (ly_set *)0x0;
      }
      do {
        if (((options & 2U) == 0) || ((node_00->flags & 0x200) != 0)) {
          iVar1 = lyxp_node_atomize(node_00,(lyxp_set *)local_68,0);
          if (iVar1 != 0) {
LAB_0015aca9:
            ly_set_free((ly_set *)set._40_8_);
            free((void *)set._8_8_);
            return (ly_set *)0x0;
          }
          if (set.val._8_4_ != 0) {
            uVar6 = 0;
            do {
              uVar4 = (ulong)((uVar6 & 0xffff) << 4);
              if (*(int *)(set._8_8_ + 8 + uVar4) == 2) {
                plVar2 = (long *)(set._8_8_ + uVar4);
                if ((options & 2U) != 0) {
                  plVar3 = (lys_node *)*plVar2;
                  while ((plVar3 != (lys_node *)0x0 && (plVar3 != plVar8))) {
                    if (plVar3->nodetype == LYS_EXT) {
                      if (plVar3->padding[1] == '\x01') {
                        plVar3 = (lys_node *)plVar3->dsc;
                        goto LAB_0015ab8c;
                      }
LAB_0015ab9b:
                      plVar3 = (lys_node *)0x0;
                    }
                    else {
                      plVar3 = plVar3->parent;
                      if (plVar3 == (lys_node *)0x0) goto LAB_0015ab9b;
LAB_0015ab8c:
                      if (plVar3->nodetype == LYS_AUGMENT) {
                        plVar3 = plVar3->prev;
                      }
                    }
                  }
                  if (plVar3 != (lys_node *)0x0) goto LAB_0015abba;
                }
                iVar1 = ly_set_add((ly_set *)set._40_8_,(void *)*plVar2,0);
                if (iVar1 == -1) goto LAB_0015aca9;
              }
LAB_0015abba:
              uVar6 = uVar6 + 1;
            } while ((uVar6 & 0xffff) < (uint)set.val._8_4_);
          }
          free((void *)set._8_8_);
          if ((options & 1U) == 0) {
            return (ly_set *)set._40_8_;
          }
        }
        if ((node_00->nodetype & (LYS_ANYDATA|LYS_LEAFLIST|LYS_LEAF)) == LYS_UNKNOWN) {
          plVar3 = node_00->child;
        }
        else {
          plVar3 = (lys_node *)0x0;
        }
        if (plVar3 == (lys_node *)0x0) {
          if (node_00 == node) {
            return (ly_set *)set._40_8_;
          }
          plVar3 = node_00->next;
        }
        if (plVar3 == (lys_node *)0x0) {
          do {
            node_00 = node_00->parent;
            if (node_00->nodetype == LYS_AUGMENT) {
              node_00 = node_00->prev;
            }
            if (node_00 == (lys_node *)0x0) {
LAB_0015ac51:
              plVar5 = (lys_node *)0x0;
            }
            else {
              if (node_00->nodetype == LYS_EXT) {
                if (node_00->padding[1] != '\x01') goto LAB_0015ac51;
                plVar5 = (lys_node *)node_00->dsc;
              }
              else {
                plVar5 = node_00->parent;
                if (plVar5 == (lys_node *)0x0) goto LAB_0015ac51;
              }
              if (plVar5->nodetype == LYS_AUGMENT) {
                plVar5 = plVar5->prev;
              }
            }
            if (node->nodetype == LYS_EXT) {
              if (node->padding[1] == '\x01') {
                plVar7 = (lys_node *)node->dsc;
                goto LAB_0015ac74;
              }
LAB_0015ac83:
              plVar7 = (lys_node *)0x0;
            }
            else {
              plVar7 = node->parent;
              if (plVar7 == (lys_node *)0x0) goto LAB_0015ac83;
LAB_0015ac74:
              if (plVar7->nodetype == LYS_AUGMENT) {
                plVar7 = plVar7->prev;
              }
            }
          } while ((plVar5 != plVar7) && (plVar3 = node_00->next, plVar3 == (lys_node *)0x0));
        }
        node_00 = plVar3;
        if (plVar3 == (lys_node *)0x0) {
          return (ly_set *)set._40_8_;
        }
      } while( true );
    }
    if (plVar8->nodetype == LYS_EXT) {
      if (plVar8->padding[1] == '\x01') {
        plVar8 = (lys_node *)plVar8->dsc;
        goto LAB_0015aadc;
      }
LAB_0015aaec:
      plVar8 = (lys_node *)0x0;
    }
    else {
      plVar8 = plVar8->parent;
      if (plVar8 == (lys_node *)0x0) goto LAB_0015aaec;
LAB_0015aadc:
      if (plVar8->nodetype == LYS_AUGMENT) {
        plVar8 = plVar8->prev;
      }
    }
    if (plVar8 == (lys_node *)0x0) {
      return (ly_set *)0x0;
    }
  } while( true );
}

Assistant:

ly_set *
lys_node_xpath_atomize(const struct lys_node *node, int options)
{
    const struct lys_node *next, *elem, *parent, *tmp;
    struct lyxp_set set;
    struct ly_set *ret_set;
    uint16_t i;

    if (!node) {
        return NULL;
    }

    for (parent = node; parent && !(parent->nodetype & (LYS_NOTIF | LYS_INPUT | LYS_OUTPUT)); parent = lys_parent(parent));
    if (!parent) {
        /* not in input, output, or notification */
        return NULL;
    }

    ret_set = ly_set_new();
    if (!ret_set) {
        return NULL;
    }

    LY_TREE_DFS_BEGIN(node, next, elem) {
        if ((options & LYXP_NO_LOCAL) && !(elem->flags & LYS_XPATH_DEP)) {
            /* elem has no dependencies from other subtrees and local nodes get discarded */
            goto next_iter;
        }

        if (lyxp_node_atomize(elem, &set, 0)) {
            ly_set_free(ret_set);
            free(set.val.snodes);
            return NULL;
        }

        for (i = 0; i < set.used; ++i) {
            switch (set.val.snodes[i].type) {
            case LYXP_NODE_ELEM:
                if (options & LYXP_NO_LOCAL) {
                    for (tmp = set.val.snodes[i].snode; tmp && (tmp != parent); tmp = lys_parent(tmp));
                    if (tmp) {
                        /* in local subtree, discard */
                        break;
                    }
                }
                if (ly_set_add(ret_set, set.val.snodes[i].snode, 0) == -1) {
                    ly_set_free(ret_set);
                    free(set.val.snodes);
                    return NULL;
                }
                break;
            default:
                /* ignore roots, text and attr should not ever appear */
                break;
            }
        }

        free(set.val.snodes);
        if (!(options & LYXP_RECURSIVE)) {
            break;
        }
next_iter:
        LY_TREE_DFS_END(node, next, elem);
    }

    return ret_set;
}